

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O2

mraa_board_t * mraa_lec_al_board(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mraa_board_t *pmVar4;
  FILE *__stream;
  __ssize_t _Var5;
  size_t sVar6;
  char *pcVar7;
  mraa_pininfo_t *pmVar8;
  mraa_adv_func_t *pmVar9;
  ssize_t sVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  char *line;
  uint local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  mraa_board_t *local_88;
  size_t len;
  char buffer [60];
  
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  line = (char *)0x0;
  pmVar4 = (mraa_board_t *)calloc(1,0x5f0);
  if (pmVar4 == (mraa_board_t *)0x0) {
    return (mraa_board_t *)0x0;
  }
  __stream = fopen("/sys/devices/virtual/dmi/id/product_name","r");
  if (__stream == (FILE *)0x0) {
    uVar11 = 0xffffffff;
  }
  else {
    _Var5 = getline(&line,&len,__stream);
    pcVar7 = line;
    if (_Var5 == -1) {
      uVar11 = 0xffffffff;
    }
    else {
      sVar6 = strcspn(line,"\r\n");
      pcVar13 = line;
      pcVar7[sVar6] = '\0';
      iVar1 = strncasecmp(line,"LEC-AL-AI",10);
      if (iVar1 == 0) {
        uVar11 = 1;
        pcVar7 = "LEC-AL AI";
      }
      else {
        iVar1 = strncasecmp(pcVar13,"LEC-ALAI",9);
        uVar11 = (uint)(iVar1 == 0);
        pcVar7 = "LEC-AL";
        if (iVar1 == 0) {
          pcVar7 = "LEC-AL AI";
        }
      }
      pmVar4->platform_name = pcVar7;
    }
    fclose(__stream);
  }
  pmVar4->phy_pin_count = 0x29;
  pmVar4->gpio_count = 0x11;
  pmVar4->chardev_capable = 0;
  pmVar8 = (mraa_pininfo_t *)malloc(0x7914);
  pmVar4->pins = pmVar8;
  if (pmVar8 == (mraa_pininfo_t *)0x0) {
LAB_0011e063:
    syslog(2,"lec_al: Platform failed to initialise");
    free(pmVar4);
    close(_fd);
    return (mraa_board_t *)0x0;
  }
  pmVar9 = (mraa_adv_func_t *)calloc(1,0x288);
  pmVar4->adv_func = pmVar9;
  if (pmVar9 == (mraa_adv_func_t *)0x0) {
    free(pmVar8);
    goto LAB_0011e063;
  }
  pmVar9->gpio_isr_replace = gpio_isr_replace;
  pmVar9->gpio_close_pre = gpio_close_pre;
  pmVar9->gpio_init_pre = gpio_init_pre;
  pmVar9->pwm_init_raw_replace = pwm_init_raw_replace;
  pmVar9->pwm_period_replace = pwm_period_replace;
  pmVar9->pwm_read_replace = pwm_read_replace;
  pmVar9->pwm_write_replace = pwm_write_replace;
  pmVar9->pwm_enable_replace = pwm_enable_replace;
  local_ac = uVar11;
  local_88 = pmVar4;
  for (uVar12 = 0; uVar12 != 999; uVar12 = uVar12 + 1) {
    snprintf(buffer,0x3c,"/sys/class/gpio/gpiochip%d/device/name",(ulong)uVar12);
    iVar1 = open(buffer,0);
    if (iVar1 != -1) {
      sVar10 = read(iVar1,buffer,7);
      iVar3 = (int)sVar10;
      if (iVar3 != 0) {
        iVar2 = strncmp(buffer,"sx1509q",(long)iVar3);
        if (iVar2 == 0) {
          base2 = uVar12;
        }
        iVar3 = strncmp(buffer,"pca9535",(long)iVar3);
        if (iVar3 == 0) {
          base1 = uVar12;
        }
      }
      close(iVar1);
    }
  }
  syslog(5,"lec_al: base1 %d base2 %d\n",(ulong)(uint)base1,(ulong)(uint)base2);
  pmVar4 = local_88;
  local_88->pwm_dev_count = 0;
  pmVar4->pwm_default_period = 5000;
  pmVar4->pwm_max_period = 0x35555;
  local_88->pwm_min_period = 1;
  mraa_lec_al_set_pininfo(local_88,1,"3v3",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,2,"5v",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,3,"I2C0_DAT",(mraa_pincapabilities_t)0x21,-1);
  mraa_lec_al_set_pininfo(pmVar4,4,"5v",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,5,"I2C0_CK",(mraa_pincapabilities_t)0x21,-1);
  mraa_lec_al_set_pininfo(pmVar4,6,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,7,"GPIO04",(mraa_pincapabilities_t)0x3,base1 + 4);
  mraa_lec_al_set_pininfo(pmVar4,8,"UART_TXD",(mraa_pincapabilities_t)0x81,-1);
  mraa_lec_al_set_pininfo(pmVar4,9,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,10,"UART_RXD",(mraa_pincapabilities_t)0x81,-1);
  mraa_lec_al_set_pininfo(pmVar4,0xb,"GPIO05",(mraa_pincapabilities_t)0x3,base1 + 6);
  mraa_lec_al_set_pininfo(pmVar4,0xc,"GPIO06",(mraa_pincapabilities_t)0x3,base1 + 5);
  pmVar8 = pmVar4->pins;
  pmVar8[0xc].pwm.pinmap = 9;
  pmVar8[0xc].pwm.parent_id = 0;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0xd,"GPIO07",(mraa_pincapabilities_t)0x3,base1 + 7);
  mraa_lec_al_set_pininfo(pmVar4,0xe,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0xf,"GPIO08",(mraa_pincapabilities_t)0x3,base1 + 8);
  mraa_lec_al_set_pininfo(pmVar4,0x10,"GPIO09",(mraa_pincapabilities_t)0x3,base1 + 9);
  mraa_lec_al_set_pininfo(pmVar4,0x11,"3v3",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x12,"GPIO10",(mraa_pincapabilities_t)0x3,base1 + 10);
  mraa_lec_al_set_pininfo(pmVar4,0x13,"SPI_0_MOSI",(mraa_pincapabilities_t)0x11,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x14,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x15,"SPI_0_MISO",(mraa_pincapabilities_t)0x11,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x16,"GPIO11",(mraa_pincapabilities_t)0x3,base1 + 0xb);
  mraa_lec_al_set_pininfo(pmVar4,0x17,"SPI_0_SCLK",(mraa_pincapabilities_t)0x11,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x18,"SPI_0_CE0",(mraa_pincapabilities_t)0x11,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x19,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x1a,"SPI_0_CE1",(mraa_pincapabilities_t)0x11,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x1b,"I2C1_DAT",(mraa_pincapabilities_t)0x21,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x1c,"I2C1_CK",(mraa_pincapabilities_t)0x21,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x1d,"GPIO1_0",(mraa_pincapabilities_t)0x7,base2);
  pmVar8 = pmVar4->pins;
  pmVar8[0x1d].pwm.pinmap = 0;
  pmVar8[0x1d].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x1e,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x1f,"GPIO1_1",(mraa_pincapabilities_t)0x7,base2 + 1);
  pmVar8 = pmVar4->pins;
  pmVar8[0x1f].pwm.pinmap = 1;
  pmVar8[0x1f].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x20,"GPIO1_2",(mraa_pincapabilities_t)0x7,base2 + 2);
  pmVar8 = pmVar4->pins;
  pmVar8[0x20].pwm.pinmap = 2;
  pmVar8[0x20].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x21,"GPIO1_3",(mraa_pincapabilities_t)0x7,base2 + 3);
  pmVar8 = pmVar4->pins;
  pmVar8[0x21].pwm.pinmap = 3;
  pmVar8[0x21].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x22,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x23,"GPIO1_4",(mraa_pincapabilities_t)0x7,base2 + 4);
  pmVar8 = pmVar4->pins;
  pmVar8[0x23].pwm.pinmap = 4;
  pmVar8[0x23].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x24,"GPIO1_5",(mraa_pincapabilities_t)0x7,base2 + 5);
  pmVar8 = pmVar4->pins;
  pmVar8[0x24].pwm.pinmap = 5;
  pmVar8[0x24].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x25,"GPIO1_6",(mraa_pincapabilities_t)0x7,base2 + 6);
  pmVar8 = pmVar4->pins;
  pmVar8[0x25].pwm.pinmap = 6;
  pmVar8[0x25].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x26,"GPIO1_7",(mraa_pincapabilities_t)0x7,base2 + 7);
  pmVar8 = pmVar4->pins;
  pmVar8[0x26].pwm.pinmap = 7;
  pmVar8[0x26].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  mraa_lec_al_set_pininfo(pmVar4,0x27,"GND",(mraa_pincapabilities_t)0x1,-1);
  mraa_lec_al_set_pininfo(pmVar4,0x28,"GPIO2_8",(mraa_pincapabilities_t)0x7,base2 + 8);
  pmVar8 = pmVar4->pins;
  pmVar8[0x28].pwm.pinmap = 8;
  pmVar8[0x28].pwm.parent_id = 1;
  pmVar4->pwm_dev_count = pmVar4->pwm_dev_count + 1;
  pmVar4->uart_dev_count = 1;
  mraa_lec_al_get_pin_index(pmVar4,"UART_RXD",&pmVar4->uart_dev[0].rx);
  mraa_lec_al_get_pin_index(pmVar4,"UART_TXD",&pmVar4->uart_dev[0].tx);
  pmVar4->uart_dev[0].device_path = "/dev/ttyS4";
  pmVar4->def_uart_dev = 0;
  pmVar4->spi_bus_count = 0;
  pmVar4->spi_bus[0].bus_id = 1;
  pmVar4->spi_bus[0].slave_s = 0;
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_CE0",&pmVar4->spi_bus[0].cs);
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_MOSI",&pmVar4->spi_bus[pmVar4->spi_bus_count].mosi);
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_MISO",&pmVar4->spi_bus[pmVar4->spi_bus_count].miso);
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_SCLK",&pmVar4->spi_bus[pmVar4->spi_bus_count].sclk);
  iVar1 = pmVar4->spi_bus_count;
  pmVar4->spi_bus_count = iVar1 + 1;
  pmVar4->spi_bus[(long)iVar1 + 1].bus_id = 1;
  pmVar4->spi_bus[(long)iVar1 + 1].slave_s = 1;
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_CE1",&pmVar4->spi_bus[(long)iVar1 + 1].cs);
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_MOSI",&pmVar4->spi_bus[pmVar4->spi_bus_count].mosi);
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_MISO",&pmVar4->spi_bus[pmVar4->spi_bus_count].miso);
  mraa_lec_al_get_pin_index(pmVar4,"SPI_0_SCLK",&pmVar4->spi_bus[pmVar4->spi_bus_count].sclk);
  pmVar4->spi_bus_count = pmVar4->spi_bus_count + 1;
  pmVar4->i2c_bus_count = 0;
  pmVar4->def_i2c_bus = 0;
  uVar12 = mraa_find_i2c_bus_pci("0000:00","0000:00:16.1","i2c_designware.1");
  uVar11 = local_ac;
  if (uVar12 != 0xffffffff) {
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    snprintf((char *)&local_a8,0x14,"/dev/i2c-%d",(ulong)uVar12);
    _fd = open((char *)&local_a8,2);
    if ((_fd < 0) || (iVar1 = ioctl(_fd,0x706,0x3e), iVar1 < 0)) {
LAB_0011e001:
      _fd = -1;
    }
    else {
      local_a8 = CONCAT71(local_a8._1_7_,0x1e);
      sVar10 = write(_fd,&local_a8,1);
      if (sVar10 != 1) goto LAB_0011e001;
      sVar10 = read(_fd,(void *)((long)&local_a8 + 1),1);
      if (sVar10 == 1) {
        local_a8 = local_a8 | 0xdf00;
        sVar10 = write(_fd,&local_a8,2);
        if (sVar10 != 2) goto LAB_0011e001;
      }
      local_a8 = CONCAT71(local_a8._1_7_,0x1f);
      sVar10 = write(_fd,&local_a8,1);
      if ((sVar10 != 1) || (sVar10 = read(_fd,(void *)((long)&local_a8 + 1),1), sVar10 != 1))
      goto LAB_0011e001;
      local_a8 = local_a8 & 0xffffffffffff07ff | 0x1000;
      sVar10 = write(_fd,&local_a8,2);
      if (sVar10 != 2) goto LAB_0011e001;
    }
    pmVar4->i2c_bus[0].bus_id = uVar12;
    mraa_lec_al_get_pin_index(pmVar4,"I2C1_DAT",&pmVar4->i2c_bus[1].sda);
    mraa_lec_al_get_pin_index(pmVar4,"I2C1_CK",&pmVar4->i2c_bus[1].scl);
    pmVar4->i2c_bus_count = pmVar4->i2c_bus_count + 1;
  }
  if (uVar11 == 0) {
    pcVar13 = "0000:00:1f.1";
    pcVar7 = ".";
  }
  else {
    if (uVar11 != 1) goto LAB_0011e0ab;
    pcVar13 = "0000:00:16.3";
    pcVar7 = "i2c_designware.3";
  }
  uVar12 = mraa_find_i2c_bus_pci("0000:00",pcVar13,pcVar7);
LAB_0011e0ab:
  if (uVar12 != 0xffffffff) {
    pmVar4->i2c_bus[1].bus_id = uVar12;
    mraa_lec_al_get_pin_index(pmVar4,"I2C0_DAT",&pmVar4->i2c_bus[0].sda);
    mraa_lec_al_get_pin_index(pmVar4,"I2C0_CK",&pmVar4->i2c_bus[0].scl);
    pmVar4->i2c_bus_count = pmVar4->i2c_bus_count + 1;
  }
  iVar1 = access("/sys/bus/platform/drivers/broxton-pinctrl",0);
  pcVar7 = "";
  if (iVar1 == -1) {
    pcVar7 = "un";
  }
  syslog(5,"lec_al: kernel pinctrl driver %savailable",pcVar7);
  return pmVar4;
}

Assistant:

mraa_board_t* mraa_lec_al_board()
{
	int i, fd, i2c_bus_num;
	int lecalai  = -1;
	char buffer[60] = {0}, *line = NULL;
	FILE *fh;
	size_t len;

	mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof (mraa_board_t));

	if (b == NULL) {
		return NULL;
	}

	if((fh = fopen("/sys/devices/virtual/dmi/id/product_name", "r")) != NULL) {
		if (getline(&line, &len, fh) != -1) {
			line[strcspn(line, "\r\n")] = 0;
			if ((strncasecmp(line, "LEC-AL-AI", strlen("LEC-AL-AI") + 1) == 0)\
				       || (strncasecmp(line, "LEC-ALAI", strlen("LEC-ALAI") + 1) == 0)) {
				b->platform_name = PLATFORM_NAME_AI;
				lecalai = 1;
			}
			else
			{
				lecalai = 0;
				b->platform_name = PLATFORM_NAME;
			}
		}
		fclose(fh);
	}

	b->phy_pin_count = MRAA_LEC_AL_PINCOUNT;
	b->gpio_count = MRAA_LEC_AL_GPIOCOUNT;
	b->chardev_capable = 0;

	b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_LEC_AL_PINCOUNT);
	if (b->pins == NULL) {
		goto error;
	}

	b->adv_func = (mraa_adv_func_t *) calloc(1, sizeof (mraa_adv_func_t));
	if (b->adv_func == NULL) {
		free(b->pins);
		goto error;
	}

	b->adv_func->gpio_isr_replace = gpio_isr_replace;
	b->adv_func->gpio_close_pre = gpio_close_pre;
	b->adv_func->gpio_init_pre = gpio_init_pre;

	// initializations of pwm functions
	b->adv_func->pwm_init_raw_replace = pwm_init_raw_replace;
	b->adv_func->pwm_period_replace = pwm_period_replace;
	b->adv_func->pwm_read_replace = pwm_read_replace;
	b->adv_func->pwm_write_replace = pwm_write_replace;
	b->adv_func->pwm_enable_replace = pwm_enable_replace;

	for(i = 0; i < 999; i++)
	{
		snprintf(buffer, sizeof(buffer), "/sys/class/gpio/gpiochip%d/device/name",i);
		if((fd = open(buffer, O_RDONLY)) != -1)
		{
			int count = read(fd,buffer,7);
			if(count != 0)
			{
				if(strncmp(buffer, "sx1509q", count) == 0)
				{
					base2 = i;
				}
				if(strncmp(buffer, "pca9535", count) == 0)
				{
					base1 = i;
				}
			}
			close(fd);
		}
	}

	syslog(LOG_NOTICE, "lec_al: base1 %d base2 %d\n", base1, base2);

	// Configure PWM
	b->pwm_dev_count = 0;
	b->pwm_default_period = 5000;
	b->pwm_max_period = 218453;
	b->pwm_min_period = 1;

	mraa_lec_al_set_pininfo(b, 1,  "3v3",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 2,  "5v",         (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 3,  "I2C0_DAT",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 4,  "5v",         (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 5,  "I2C0_CK",    (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 6,  "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 7,  "GPIO04",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 4);
	mraa_lec_al_set_pininfo(b, 8,  "UART_TXD",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, -1);
	mraa_lec_al_set_pininfo(b, 9,  "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 10, "UART_RXD",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, -1);
	mraa_lec_al_set_pininfo(b, 11, "GPIO05",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 6);
	mraa_lec_al_set_pininfo(b, 12, "GPIO06",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 5);
	b->pins[12].pwm.parent_id = 0;
	b->pins[12].pwm.pinmap = 9;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 13, "GPIO07",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 7);
	mraa_lec_al_set_pininfo(b, 14, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 15, "GPIO08",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 8);
	mraa_lec_al_set_pininfo(b, 16, "GPIO09",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 9);
	mraa_lec_al_set_pininfo(b, 17, "3v3",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 18, "GPIO10",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 10);
	mraa_lec_al_set_pininfo(b, 19, "SPI_0_MOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 20, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 21, "SPI_0_MISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 22, "GPIO11",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 11);
	mraa_lec_al_set_pininfo(b, 23, "SPI_0_SCLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 24, "SPI_0_CE0",  (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 25, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 26, "SPI_0_CE1",  (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 27, "I2C1_DAT",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 28, "I2C1_CK",    (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);

	mraa_lec_al_set_pininfo(b, 29, "GPIO1_0",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 0);
	b->pins[29].pwm.parent_id = 1;
	b->pins[29].pwm.pinmap = 0;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 30, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 31, "GPIO1_1",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 1);
	b->pins[31].pwm.parent_id = 1;
	b->pins[31].pwm.pinmap = 1;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 32, "GPIO1_2",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 2);
	b->pins[32].pwm.parent_id = 1;
	b->pins[32].pwm.pinmap = 2;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 33, "GPIO1_3",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 3);
	b->pins[33].pwm.parent_id = 1;
	b->pins[33].pwm.pinmap = 3;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 34, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 35, "GPIO1_4",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 4);
	b->pins[35].pwm.parent_id = 1;
	b->pins[35].pwm.pinmap = 4;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 36, "GPIO1_5",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 5);
	b->pins[36].pwm.parent_id = 1;
	b->pins[36].pwm.pinmap = 5;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 37, "GPIO1_6",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 6);
	b->pins[37].pwm.parent_id = 1;
	b->pins[37].pwm.pinmap = 6;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 38, "GPIO1_7",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 7);
	b->pins[38].pwm.parent_id = 1;
	b->pins[38].pwm.pinmap = 7;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 39, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 40, "GPIO2_8",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 8);
	b->pins[40].pwm.parent_id = 1;
	b->pins[40].pwm.pinmap = 8;
	b->pwm_dev_count++;


	// Configure UART #1 (default)
	b->uart_dev_count = 1;

	mraa_lec_al_get_pin_index(b, "UART_RXD",  &(b->uart_dev[0].rx));
	mraa_lec_al_get_pin_index(b, "UART_TXD",  &(b->uart_dev[0].tx));
	b->uart_dev[0].device_path = "/dev/ttyS4";

	b->def_uart_dev = 0;

	// Configure SPI #0 CS1
	b->spi_bus_count = 0;
	b->spi_bus[b->spi_bus_count].bus_id = 1;
	b->spi_bus[b->spi_bus_count].slave_s = 0;
	mraa_lec_al_get_pin_index(b, "SPI_0_CE0",  &(b->spi_bus[b->spi_bus_count].cs));
	mraa_lec_al_get_pin_index(b, "SPI_0_MOSI", &(b->spi_bus[b->spi_bus_count].mosi));
	mraa_lec_al_get_pin_index(b, "SPI_0_MISO", &(b->spi_bus[b->spi_bus_count].miso));
	mraa_lec_al_get_pin_index(b, "SPI_0_SCLK",  &(b->spi_bus[b->spi_bus_count].sclk));
	b->spi_bus_count++;

	b->spi_bus[b->spi_bus_count].bus_id = 1;
	b->spi_bus[b->spi_bus_count].slave_s = 1;
	mraa_lec_al_get_pin_index(b, "SPI_0_CE1",  &(b->spi_bus[b->spi_bus_count].cs));
	mraa_lec_al_get_pin_index(b, "SPI_0_MOSI", &(b->spi_bus[b->spi_bus_count].mosi));
	mraa_lec_al_get_pin_index(b, "SPI_0_MISO", &(b->spi_bus[b->spi_bus_count].miso));
	mraa_lec_al_get_pin_index(b, "SPI_0_SCLK",  &(b->spi_bus[b->spi_bus_count].sclk));
	b->spi_bus_count++;

	// Set number of i2c adaptors usable from userspace
	b->i2c_bus_count = 0;
	b->def_i2c_bus = 0;

	i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:16.1", "i2c_designware.1");
	if (i2c_bus_num != -1) {
		if(sx150x_init(i2c_bus_num) < 0)
		{
			_fd = -1;
		}

		b->i2c_bus[0].bus_id = i2c_bus_num;
		mraa_lec_al_get_pin_index(b, "I2C1_DAT", (int*) &(b->i2c_bus[1].sda));
		mraa_lec_al_get_pin_index(b, "I2C1_CK", (int*) &(b->i2c_bus[1].scl));
		b->i2c_bus_count++;
	}

	if(lecalai == 1)
	{
		i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:16.3", "i2c_designware.3");
	}
	else if(lecalai == 0)
	{
		i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:1f.1", ".");
	}
	if (i2c_bus_num != -1) {
		b->i2c_bus[1].bus_id = i2c_bus_num;
		mraa_lec_al_get_pin_index(b, "I2C0_DAT", (int*) &(b->i2c_bus[0].sda));
		mraa_lec_al_get_pin_index(b, "I2C0_CK", (int*) &(b->i2c_bus[0].scl));
		b->i2c_bus_count++;
	}

	const char* pinctrl_path = "/sys/bus/platform/drivers/broxton-pinctrl";
	int have_pinctrl = access(pinctrl_path, F_OK) != -1;
	syslog(LOG_NOTICE, "lec_al: kernel pinctrl driver %savailable", have_pinctrl ? "" : "un");

	return b;

error:
	syslog(LOG_CRIT, "lec_al: Platform failed to initialise");
	free(b);
	close(_fd);
	return NULL;
}